

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestCharReaderTestparseWithOneError::TestCharReaderTestparseWithOneError
          (TestCharReaderTestparseWithOneError *this)

{
  CharReaderTest *in_RDI;
  
  CharReaderTest::CharReaderTest(in_RDI);
  (in_RDI->super_TestCase)._vptr_TestCase =
       (_func_int **)&PTR__TestCharReaderTestparseWithOneError_001b5228;
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseWithOneError) {
  Json::CharReaderBuilder b;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  Json::Value root;
  char const doc[] =
      "{ \"property\" :: \"value\" }";
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT(errs ==
                  "* Line 1, Column 15\n  Syntax error: value, object or array "
                  "expected.\n");
  delete reader;
}